

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ncnnoptimize.cpp
# Opt level: O0

int __thiscall NetOptimize::eliminate_split(NetOptimize *this)

{
  int iVar1;
  value_type pLVar2;
  value_type pLVar3;
  bool bVar4;
  size_type sVar5;
  reference ppLVar6;
  size_type sVar7;
  reference pvVar8;
  reference pvVar9;
  undefined8 uVar10;
  long in_RDI;
  int top_blob_index_final;
  Layer *any;
  size_t k;
  int j;
  int top_i;
  int bottom_blob_index;
  int top_blob_index_final_1;
  size_t j_1;
  size_t top_blob_count;
  int real_split_top_blob_index;
  int real_split_output_count;
  Layer *split;
  size_t i;
  size_t layer_count;
  FILE *in_stack_ffffffffffffff78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff80;
  ulong local_50;
  int local_48;
  int local_44;
  size_type local_38;
  int local_28;
  int local_24;
  size_type local_18;
  
  sVar5 = std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::size
                    (*(vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> **)(in_RDI + 0x58));
  local_18 = 0;
  do {
    if (sVar5 <= local_18) {
      return 0;
    }
    std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
              (*(vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> **)(in_RDI + 0x58),local_18);
    bVar4 = std::operator!=(in_stack_ffffffffffffff80,(char *)in_stack_ffffffffffffff78);
    if (!bVar4) {
      ppLVar6 = std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
                          (*(vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> **)
                            (in_RDI + 0x58),local_18);
      pLVar2 = *ppLVar6;
      local_24 = 0;
      local_28 = -1;
      sVar7 = std::vector<int,_std::allocator<int>_>::size(&pLVar2->tops);
      for (local_38 = 0; local_38 < sVar7; local_38 = local_38 + 1) {
        pvVar8 = std::vector<int,_std::allocator<int>_>::operator[](&pLVar2->tops,local_38);
        pvVar9 = std::vector<ncnn::Blob,_std::allocator<ncnn::Blob>_>::operator[]
                           (*(vector<ncnn::Blob,_std::allocator<ncnn::Blob>_> **)(in_RDI + 0x50),
                            (long)*pvVar8);
        if (pvVar9->consumer != -1) {
          local_24 = local_24 + 1;
          local_28 = (int)local_38;
        }
      }
      if (local_24 < 2) {
        pvVar8 = std::vector<int,_std::allocator<int>_>::operator[](&pLVar2->bottoms,0);
        iVar1 = *pvVar8;
        local_44 = -1;
        local_48 = (int)local_18;
        do {
          do {
            local_48 = local_48 + -1;
            if (local_48 < 0) goto LAB_001876c9;
            std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
                      (*(vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> **)(in_RDI + 0x58),
                       (long)local_48);
            bVar4 = std::operator==(in_stack_ffffffffffffff80,(char *)in_stack_ffffffffffffff78);
          } while (bVar4);
          local_50 = 0;
          while( true ) {
            ppLVar6 = std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
                                (*(vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> **)
                                  (in_RDI + 0x58),(long)local_48);
            sVar7 = std::vector<int,_std::allocator<int>_>::size(&(*ppLVar6)->tops);
            if (sVar7 <= local_50) break;
            ppLVar6 = std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
                                (*(vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> **)
                                  (in_RDI + 0x58),(long)local_48);
            pvVar8 = std::vector<int,_std::allocator<int>_>::operator[](&(*ppLVar6)->tops,local_50);
            if (*pvVar8 == iVar1) {
              local_44 = (int)local_50;
              break;
            }
            local_50 = local_50 + 1;
          }
        } while (local_44 == -1);
LAB_001876c9:
        if (local_48 != -1) {
          ppLVar6 = std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
                              (*(vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> **)
                                (in_RDI + 0x58),(long)local_48);
          pLVar3 = *ppLVar6;
          in_stack_ffffffffffffff78 = _stderr;
          in_stack_ffffffffffffff80 =
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               std::__cxx11::string::c_str();
          uVar10 = std::__cxx11::string::c_str();
          fprintf(in_stack_ffffffffffffff78,"eliminate_split %s %s\n",in_stack_ffffffffffffff80,
                  uVar10);
          pvVar8 = std::vector<int,_std::allocator<int>_>::operator[](&pLVar2->tops,(long)local_28);
          iVar1 = *pvVar8;
          pvVar8 = std::vector<int,_std::allocator<int>_>::operator[](&pLVar3->tops,(long)local_44);
          *pvVar8 = iVar1;
          pvVar9 = std::vector<ncnn::Blob,_std::allocator<ncnn::Blob>_>::operator[]
                             (*(vector<ncnn::Blob,_std::allocator<ncnn::Blob>_> **)(in_RDI + 0x50),
                              (long)iVar1);
          pvVar9->producer = local_48;
          std::__cxx11::string::operator=((string *)&pLVar2->type,"ncnnfused");
        }
      }
    }
    local_18 = local_18 + 1;
  } while( true );
}

Assistant:

int NetOptimize::eliminate_split()
{
    const size_t layer_count = layers.size();
    for (size_t i = 0; i < layer_count; i++)
    {
        if (layers[i]->type != "Split")
            continue;

        ncnn::Layer* split = layers[i];

        int real_split_output_count = 0;
        int real_split_top_blob_index = -1;
        size_t top_blob_count = split->tops.size();
        for (size_t j = 0; j < top_blob_count; j++)
        {
            int top_blob_index_final = split->tops[j];
            if (blobs[top_blob_index_final].consumer != -1)
            {
                real_split_output_count += 1;
                real_split_top_blob_index = j;
            }
        }

        if (real_split_output_count > 1)
            continue;

        // Any - Pooling
        int bottom_blob_index = split->bottoms[0];

        int top_i = -1;
        int j = i - 1;
        for (; j >= 0; j--)
        {
            if (layers[j]->type == "ncnnfused")
                continue;

            for (size_t k = 0; k < layers[j]->tops.size(); k++)
            {
                if (layers[j]->tops[k] == bottom_blob_index)
                {
                    top_i = k;
                    break;
                }
            }

            if (top_i != -1)
                break;
        }

        if (j == -1)
            continue;

        ncnn::Layer* any = layers[j];

        fprintf(stderr, "eliminate_split %s %s\n", any->name.c_str(), split->name.c_str());

        int top_blob_index_final = split->tops[real_split_top_blob_index];
        any->tops[top_i] = top_blob_index_final;
        blobs[top_blob_index_final].producer = j;
        split->type = "ncnnfused";
    }

    return 0;
}